

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsStamp.cpp
# Opt level: O1

void __thiscall OpenMD::ZConsStamp::ZConsStamp(ZConsStamp *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  ParameterBase *local_60;
  string *local_58;
  ParameterBase *local_50;
  string *local_48;
  ParameterBase *local_40;
  string *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ZConsStamp_00254968;
  local_40 = &(this->MolIndex).super_ParameterBase;
  psVar2 = &(this->MolIndex).super_ParameterBase.keyword_;
  local_68 = &(this->MolIndex).super_ParameterBase.keyword_.field_2;
  (this->MolIndex).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_68;
  (this->MolIndex).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MolIndex).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MolIndex).super_ParameterBase.optional_ = false;
  (this->MolIndex).super_ParameterBase.defaultValue_ = false;
  (this->MolIndex).super_ParameterBase.empty_ = true;
  (this->MolIndex).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_00252670;
  local_50 = &(this->Zpos).super_ParameterBase;
  (this->Zpos).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_00252190;
  local_48 = (string *)&(this->Zpos).super_ParameterBase.keyword_;
  local_70 = &(this->Zpos).super_ParameterBase.keyword_.field_2;
  (this->Zpos).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_70;
  (this->Zpos).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Zpos).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Zpos).super_ParameterBase.optional_ = false;
  (this->Zpos).super_ParameterBase.defaultValue_ = false;
  (this->Zpos).super_ParameterBase.empty_ = true;
  (this->Zpos).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002525f8;
  local_60 = &(this->Kratio).super_ParameterBase;
  local_58 = (string *)&(this->Kratio).super_ParameterBase.keyword_;
  local_78 = &(this->Kratio).super_ParameterBase.keyword_.field_2;
  (this->Kratio).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_78;
  (this->Kratio).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Kratio).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Kratio).super_ParameterBase.optional_ = false;
  (this->Kratio).super_ParameterBase.defaultValue_ = false;
  (this->Kratio).super_ParameterBase.empty_ = true;
  (this->Kratio).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002525f8;
  local_80 = &(this->CantVel).super_ParameterBase.keyword_.field_2;
  (this->CantVel).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_80;
  (this->CantVel).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CantVel).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CantVel).super_ParameterBase.optional_ = false;
  (this->CantVel).super_ParameterBase.defaultValue_ = false;
  (this->CantVel).super_ParameterBase.empty_ = true;
  (this->CantVel).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002525f8;
  paVar3 = &local_c8.first.field_2;
  local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  local_38 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"molIndex","");
  std::__cxx11::string::_M_assign((string *)psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"molIndex","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_a0 == &local_90) {
    local_c8.first.field_2._8_8_ = local_90._8_8_;
    local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c8.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_c8.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_c8.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_c8.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_c8.second = local_40;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"zPos","");
  std::__cxx11::string::_M_assign(local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->Zpos).super_ParameterBase.optional_ = true;
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"zPos","");
  if (local_a0 == &local_90) {
    local_c8.first.field_2._8_8_ = local_90._8_8_;
    local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c8.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_c8.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_c8.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_c8.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_c8.second = local_50;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"kRatio","");
  std::__cxx11::string::_M_assign(local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->Kratio).super_ParameterBase.optional_ = true;
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"kRatio","");
  if (local_a0 == &local_90) {
    local_c8.first.field_2._8_8_ = local_90._8_8_;
    local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c8.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_c8.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_c8.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_c8.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_c8.second = local_60;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"cantVel","");
  std::__cxx11::string::_M_assign((string *)&(this->CantVel).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->CantVel).super_ParameterBase.optional_ = true;
  local_a0 = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"cantVel","");
  if (local_a0 == &local_90) {
    local_c8.first.field_2._8_8_ = local_90._8_8_;
    local_c8.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c8.first._M_dataplus._M_p = (pointer)local_a0;
  }
  local_c8.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
  local_c8.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
  local_c8.first._M_string_length = local_98;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_c8.second = &(this->CantVel).super_ParameterBase;
  local_a0 = &local_90;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8.first._M_dataplus._M_p,local_c8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

ZConsStamp::ZConsStamp() {
    DefineParameter(MolIndex, "molIndex");
    DefineOptionalParameter(Zpos, "zPos");
    DefineOptionalParameter(Kratio, "kRatio");
    DefineOptionalParameter(CantVel, "cantVel");
  }